

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

value_type __thiscall
jsoncons::jsonpath::detail::
abs_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(abs_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  json_type jVar2;
  long lVar3;
  unsigned_long uVar4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar5;
  error_code *in_RCX;
  unsigned_long uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other;
  double dVar8;
  value_type vVar9;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  
  pbVar5 = &arg0;
  pcVar1 = *(char **)ec;
  if ((pointer)(((long)ec->_M_cat - (long)pcVar1) / 0x18) !=
      (args->
      super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar5);
    uVar7 = extraout_RDX;
    goto LAB_0036bb6c;
  }
  if (*pcVar1 == '\0') {
    other = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
             (pcVar1 + 8);
  }
  else {
    other = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
            (pcVar1 + 8);
  }
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            (&arg0,other);
  jVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type(&arg0);
  if (jVar2 == int64_value) {
    lVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
            as_integer<long>(&arg0);
    if (-1 < lVar3) goto LAB_0036bb59;
    uVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
            as_integer<long>(&arg0);
    uVar6 = -uVar4;
    if (0 < (long)uVar4) {
      uVar6 = uVar4;
    }
    *(undefined2 *)
     &(this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      )._vptr_function_base = 2;
    (this->
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar6;
  }
  else if (jVar2 == uint64_value) {
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_move
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               &arg0);
  }
  else {
    if (jVar2 == double_value) {
      dVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as_double
                        (&arg0);
      pbVar5 = &arg0;
      if (dVar8 < 0.0) {
        dVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                as_double(&arg0);
        *(undefined2 *)
         &(this->
          super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          )._vptr_function_base = 5;
        (this->
        super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)ABS(dVar8);
        goto LAB_0036bb64;
      }
    }
    else {
      std::error_code::operator=(in_RCX,invalid_type);
      pbVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    }
LAB_0036bb59:
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar5);
  }
LAB_0036bb64:
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json(&arg0);
  uVar7 = extraout_RDX_00;
LAB_0036bb6c:
  vVar9.field_0.int64_.val_ = uVar7;
  vVar9.field_0._0_8_ = this;
  return (value_type)vVar9.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
                 std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            switch (arg0.type())
            {
                case json_type::uint64_value:
                    return arg0;
                case json_type::int64_value:
                {
                    return arg0.template as<int64_t>() >= 0 ? arg0 : value_type(std::abs(arg0.template as<int64_t>()), semantic_tag::none);
                }
                case json_type::double_value:
                {
                    return arg0.template as<double>() >= 0 ? arg0 : value_type(std::abs(arg0.template as<double>()), semantic_tag::none);
                }
                default:
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
            }
        }